

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkInputCallback *
cdecklink_internal_callback_create_deck_link_input_callback
          (void *ctx,undefined1 *cb0,cdecklink_input_callback_video_input_frame_arrived *cb1)

{
  cdecklink_input_callback_video_input_frame_arrived *cb1_local;
  undefined1 *cb0_local;
  void *ctx_local;
  
  if ((cb0 == (undefined1 *)0x0) &&
     (cb1 == (cdecklink_input_callback_video_input_frame_arrived *)0x0)) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x28);
    DeckLinkInputCallback::DeckLinkInputCallback((DeckLinkInputCallback *)ctx_local,ctx,cb0,cb1);
  }
  return (IDeckLinkInputCallback *)ctx_local;
}

Assistant:

IDeckLinkInputCallback* cdecklink_internal_callback_create_deck_link_input_callback (void *ctx, cdecklink_input_callback_video_input_format_changed *cb0, cdecklink_input_callback_video_input_frame_arrived *cb1) {
	if (cb0 != nullptr || cb1 != nullptr) {
		return new DeckLinkInputCallback(ctx, cb0, cb1);
	}
	return nullptr;
}